

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O1

Term * Inferences::getPlaceholderForTerm
                 (vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_> *ts,uint i)

{
  Symbol *this;
  Signature *this_00;
  TermList TVar1;
  uint function;
  Entry *pEVar2;
  long *plVar3;
  undefined8 *puVar4;
  OperatorKey *key;
  OperatorType *type;
  Term *val;
  ulong *puVar5;
  ulong uVar6;
  undefined8 uVar7;
  pair<Kernel::TermList,_unsigned_int> key_00;
  TermList srt;
  pair<Kernel::TermList,_unsigned_int> local_b8;
  long local_a8;
  undefined8 uStack_a0;
  ulong *local_98;
  long local_90;
  ulong local_88;
  long lStack_80;
  TermList local_78;
  string local_70;
  pair<Kernel::TermList,_unsigned_int> local_50;
  string local_40;
  
  if (getPlaceholderForTerm(std::vector<Kernel::Term*,std::allocator<Kernel::Term*>>const&,unsigned_int)
      ::placeholders == '\0') {
    getPlaceholderForTerm();
  }
  local_78 = Kernel::SortHelper::getResultSort
                       ((ts->super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>).
                        _M_impl.super__Vector_impl_data._M_start[(long)(ulong)i]);
  local_50.first = local_78;
  local_50.second = i;
  pEVar2 = ::Lib::
           DHMap<std::pair<Kernel::TermList,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
           ::findEntry(&getPlaceholderForTerm::placeholders,&local_50);
  this_00 = DAT_00b7e1b0;
  if (pEVar2 != (Entry *)0x0) {
    local_b8.first._content = local_50.first._content;
    local_b8.second = local_50.second;
    pEVar2 = ::Lib::
             DHMap<std::pair<Kernel::TermList,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
             ::findEntry(&getPlaceholderForTerm::placeholders,&local_b8);
    return pEVar2->_val;
  }
  Kernel::TermList::toString_abi_cxx11_(&local_40,&local_78,false);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_40);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_88 = *puVar5;
    lStack_80 = plVar3[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *puVar5;
    local_98 = (ulong *)*plVar3;
  }
  local_90 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  ::Lib::Int::toString_abi_cxx11_(&local_70,(Int *)(ulong)i,(uint)local_90);
  uVar6 = 0xf;
  if (local_98 != &local_88) {
    uVar6 = local_88;
  }
  if (uVar6 < local_70._M_string_length + local_90) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      uVar7 = local_70.field_2._M_allocated_capacity;
    }
    if (local_70._M_string_length + local_90 <= (ulong)uVar7) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_98);
      goto LAB_004e3c89;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_70._M_dataplus._M_p);
LAB_004e3c89:
  local_b8.first._content = (uint64_t)&local_a8;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_a8 = *plVar3;
    uStack_a0 = puVar4[3];
  }
  else {
    local_a8 = *plVar3;
    local_b8.first._content = (uint64_t)*puVar4;
  }
  local_b8._8_8_ = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  function = Kernel::Signature::addFreshFunction
                       (this_00,0,(char *)local_b8.first._content,(char *)0x0);
  if ((long *)local_b8.first._content != &local_a8) {
    operator_delete((void *)local_b8.first._content,local_a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  TVar1._content = local_78._content;
  this = (DAT_00b7e1b0->_funs)._stack[function];
  key = Kernel::OperatorType::setupKey(0,(TermList *)0x0);
  *(uint64_t *)(key + 8) = TVar1._content;
  type = Kernel::OperatorType::getTypeFromKey(key,0);
  Kernel::Signature::Symbol::setType(this,type);
  val = Kernel::Term::create(function,0,(TermList *)0x0);
  key_00.second = local_50.second;
  key_00.first._content = local_50.first._content;
  key_00._12_4_ = 0;
  ::Lib::
  DHMap<std::pair<Kernel::TermList,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::insert(&getPlaceholderForTerm::placeholders,key_00,val);
  return val;
}

Assistant:

Term* getPlaceholderForTerm(const std::vector<Term*>& ts, unsigned i)
{
  static DHMap<pair<TermList,unsigned>,Term*> placeholders;
  TermList srt = SortHelper::getResultSort(ts[i]);
  auto p = make_pair(srt,i);
  if(!placeholders.find(p)){
    unsigned fresh = env.signature->addFreshFunction(0,(srt.toString() + "_placeholder" + Int::toString(i)).c_str());
    env.signature->getFunction(fresh)->setType(OperatorType::getConstantsType(srt));
    auto res = Term::createConstant(fresh);
    placeholders.insert(p,res);
    return res;
  }
  return placeholders.get(p);
}